

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

int mbedtls_internal_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  int iVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint auStack_190 [12];
  undefined8 uStack_160;
  uint local_158 [2];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint auStack_140 [60];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_50 = *(undefined8 *)ctx->state;
  uStack_48 = *(undefined8 *)(ctx->state + 2);
  local_40 = *(undefined8 *)(ctx->state + 4);
  uVar31 = *(undefined8 *)(ctx->state + 6);
  uVar37 = local_40;
  uStack_38 = uVar31;
  uVar31 = uStack_38;
  uVar35 = local_50;
  uVar36 = uStack_48;
  lVar38 = 0;
  do {
    auVar51 = *(undefined1 (*) [16])(data + lVar38 * 4);
    auVar52[1] = 0;
    auVar52[0] = auVar51[8];
    auVar52[2] = auVar51[9];
    auVar52[3] = 0;
    auVar52[4] = auVar51[10];
    auVar52[5] = 0;
    auVar52[6] = auVar51[0xb];
    auVar52[7] = 0;
    auVar52[8] = auVar51[0xc];
    auVar52[9] = 0;
    auVar52[10] = auVar51[0xd];
    auVar52[0xb] = 0;
    auVar52[0xc] = auVar51[0xe];
    auVar52[0xd] = 0;
    auVar52[0xe] = auVar51[0xf];
    auVar52[0xf] = 0;
    auVar52 = pshuflw(auVar52,auVar52,0x1b);
    auVar52 = pshufhw(auVar52,auVar52,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar51._0_13_;
    auVar21[0xe] = auVar51[7];
    auVar22[0xc] = auVar51[6];
    auVar22._0_12_ = auVar51._0_12_;
    auVar22._13_2_ = auVar21._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar51._0_11_;
    auVar23._12_3_ = auVar22._12_3_;
    auVar24[10] = auVar51[5];
    auVar24._0_10_ = auVar51._0_10_;
    auVar24._11_4_ = auVar23._11_4_;
    auVar25[9] = 0;
    auVar25._0_9_ = auVar51._0_9_;
    auVar25._10_5_ = auVar24._10_5_;
    auVar26[8] = auVar51[4];
    auVar26._0_8_ = auVar51._0_8_;
    auVar26._9_6_ = auVar25._9_6_;
    auVar32._7_8_ = 0;
    auVar32._0_7_ = auVar26._8_7_;
    auVar33._1_8_ = SUB158(auVar32 << 0x40,7);
    auVar33[0] = auVar51[3];
    auVar33._9_6_ = 0;
    auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
    auVar34[0] = auVar51[2];
    auVar34._11_4_ = 0;
    auVar27[2] = auVar51[1];
    auVar27._0_2_ = auVar51._0_2_;
    auVar27._3_12_ = SUB1512(auVar34 << 0x20,3);
    auVar51._0_2_ = auVar51._0_2_ & 0xff;
    auVar51._2_13_ = auVar27._2_13_;
    auVar51[0xf] = 0;
    auVar51 = pshuflw(auVar51,auVar51,0x1b);
    auVar51 = pshufhw(auVar51,auVar51,0x1b);
    sVar5 = auVar51._0_2_;
    sVar6 = auVar51._2_2_;
    sVar7 = auVar51._4_2_;
    sVar8 = auVar51._6_2_;
    sVar9 = auVar51._8_2_;
    sVar10 = auVar51._10_2_;
    sVar11 = auVar51._12_2_;
    sVar12 = auVar51._14_2_;
    sVar13 = auVar52._0_2_;
    sVar14 = auVar52._2_2_;
    sVar15 = auVar52._4_2_;
    sVar16 = auVar52._6_2_;
    sVar17 = auVar52._8_2_;
    sVar18 = auVar52._10_2_;
    sVar19 = auVar52._12_2_;
    sVar20 = auVar52._14_2_;
    lVar1 = lVar38 * 4;
    *(char *)(&uStack_150 + lVar38) = (0 < sVar5) * (sVar5 < 0x100) * auVar51[0] - (0xff < sVar5);
    *(char *)((long)&uStack_150 + lVar1 + 1) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar51[2] - (0xff < sVar6);
    *(char *)((long)&uStack_150 + lVar1 + 2) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar51[4] - (0xff < sVar7);
    *(char *)((long)&uStack_150 + lVar1 + 3) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar51[6] - (0xff < sVar8);
    *(char *)(&uStack_14c + lVar38) = (0 < sVar9) * (sVar9 < 0x100) * auVar51[8] - (0xff < sVar9);
    *(char *)((long)&uStack_14c + lVar1 + 1) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar51[10] - (0xff < sVar10);
    *(char *)((long)&uStack_14c + lVar1 + 2) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar51[0xc] - (0xff < sVar11);
    *(char *)((long)&uStack_14c + lVar1 + 3) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar51[0xe] - (0xff < sVar12);
    *(char *)(&uStack_148 + lVar38) = (0 < sVar13) * (sVar13 < 0x100) * auVar52[0] - (0xff < sVar13)
    ;
    *(char *)((long)&uStack_148 + lVar1 + 1) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar52[2] - (0xff < sVar14);
    *(char *)((long)&uStack_148 + lVar1 + 2) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar52[4] - (0xff < sVar15);
    *(char *)((long)&uStack_148 + lVar1 + 3) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar52[6] - (0xff < sVar16);
    *(char *)(&uStack_144 + lVar38) = (0 < sVar17) * (sVar17 < 0x100) * auVar52[8] - (0xff < sVar17)
    ;
    *(char *)((long)&uStack_144 + lVar1 + 1) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar52[10] - (0xff < sVar18);
    *(char *)((long)&uStack_144 + lVar1 + 2) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar52[0xc] - (0xff < sVar19);
    *(char *)((long)&uStack_144 + lVar1 + 3) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar52[0xe] - (0xff < sVar20);
    lVar38 = lVar38 + 4;
  } while (lVar38 != 0x10);
  uStack_38._4_4_ = (uint)((ulong)uVar31 >> 0x20);
  uStack_38._0_4_ = (uint)uVar31;
  local_40._4_4_ = (uint)((ulong)local_40 >> 0x20);
  local_50._4_4_ = (uint)((ulong)local_50 >> 0x20);
  lVar38 = 8;
  uStack_48._4_4_ = (uint)((ulong)uStack_48 >> 0x20);
  uVar49 = uStack_38._4_4_;
  uVar44 = (uint)local_40;
  uVar48 = (uint)uStack_38;
  uVar43 = local_40._4_4_;
  uVar47 = (uint)local_50;
  uVar39 = local_50._4_4_;
  uVar41 = (uint)uStack_48;
  uVar46 = uStack_48._4_4_;
  local_50 = uVar35;
  uStack_48 = uVar36;
  local_40 = uVar37;
  uStack_38 = uVar31;
  do {
    iVar42 = ((uVar44 << 7 | uVar44 >> 0x19) ^
             (uVar44 << 0x15 | uVar44 >> 0xb) ^ (uVar44 << 0x1a | uVar44 >> 6)) + uVar49 +
             *(int *)(&UNK_00503df8 + lVar38) + *(int *)((long)auStack_190 + lVar38 + 0x38) +
             ((uVar43 ^ uVar48) & uVar44 ^ uVar48);
    uVar46 = uVar46 + iVar42;
    uStack_48 = CONCAT44(uVar46,(uint)uStack_48);
    uVar49 = ((uVar39 | uVar47) & uVar41 | uVar39 & uVar47) +
             ((uVar47 << 10 | uVar47 >> 0x16) ^
             (uVar47 << 0x13 | uVar47 >> 0xd) ^ (uVar47 << 0x1e | uVar47 >> 2)) + iVar42;
    uStack_38 = CONCAT44(uVar49,(uint)uStack_38);
    iVar42 = ((uVar43 ^ uVar44) & uVar46 ^ uVar43) + uVar48 + *(int *)(&UNK_00503dfc + lVar38) +
             ((uVar46 * 0x80 | uVar46 >> 0x19) ^
             (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
             *(int *)((long)auStack_190 + lVar38 + 0x3c);
    uVar41 = uVar41 + iVar42;
    uStack_48 = CONCAT44(uVar46,uVar41);
    uVar48 = ((uVar49 | uVar47) & uVar39 | uVar49 & uVar47) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar42;
    uStack_38 = CONCAT44(uVar49,uVar48);
    iVar42 = uVar43 + *(int *)((long)K + lVar38) + *(int *)((long)&uStack_150 + lVar38) +
             ((uVar46 ^ uVar44) & uVar41 ^ uVar44) +
             ((uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6));
    uVar39 = uVar39 + iVar42;
    local_50 = CONCAT44(uVar39,(uint)local_50);
    uVar43 = ((uVar48 | uVar49) & uVar47 | uVar48 & uVar49) +
             ((uVar48 * 0x400 | uVar48 >> 0x16) ^
             (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar42;
    local_40 = CONCAT44(uVar43,(uint)local_40);
    iVar42 = uVar44 + *(int *)((long)K + lVar38 + 4) + *(int *)((long)&uStack_14c + lVar38) +
             ((uVar41 ^ uVar46) & uVar39 ^ uVar46) +
             ((uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6));
    uVar47 = uVar47 + iVar42;
    local_50 = CONCAT44(uVar39,uVar47);
    uVar44 = ((uVar43 | uVar48) & uVar49 | uVar43 & uVar48) +
             ((uVar43 * 0x400 | uVar43 >> 0x16) ^
             (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar42;
    local_40 = CONCAT44(uVar43,uVar44);
    iVar42 = uVar46 + *(int *)((long)K + lVar38 + 8) + *(int *)((long)&uStack_148 + lVar38) +
             ((uVar39 ^ uVar41) & uVar47 ^ uVar41) +
             ((uVar47 * 0x80 | uVar47 >> 0x19) ^
             (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6));
    uVar49 = uVar49 + iVar42;
    uStack_38 = CONCAT44(uVar49,uVar48);
    uVar46 = iVar42 + ((uVar44 | uVar43) & uVar48 | uVar44 & uVar43) +
                      ((uVar44 * 0x400 | uVar44 >> 0x16) ^
                      (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2));
    uStack_48 = CONCAT44(uVar46,uVar41);
    iVar42 = uVar41 + *(int *)((long)K + lVar38 + 0xc) + *(int *)((long)&uStack_144 + lVar38) +
             ((uVar47 ^ uVar39) & uVar49 ^ uVar39) +
             ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6));
    uVar48 = uVar48 + iVar42;
    uStack_38 = CONCAT44(uVar49,uVar48);
    uVar41 = iVar42 + ((uVar46 | uVar44) & uVar43 | uVar46 & uVar44) +
                      ((uVar46 * 0x400 | uVar46 >> 0x16) ^
                      (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2));
    uStack_48 = CONCAT44(uVar46,uVar41);
    iVar42 = uVar39 + *(int *)((long)K + lVar38 + 0x10) + *(int *)((long)auStack_140 + lVar38) +
             ((uVar49 ^ uVar47) & uVar48 ^ uVar47) +
             ((uVar48 * 0x80 | uVar48 >> 0x19) ^
             (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6));
    uVar43 = uVar43 + iVar42;
    local_40 = CONCAT44(uVar43,uVar44);
    uVar39 = iVar42 + ((uVar41 | uVar46) & uVar44 | uVar41 & uVar46) +
                      ((uVar41 * 0x400 | uVar41 >> 0x16) ^
                      (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2));
    local_50 = CONCAT44(uVar39,uVar47);
    iVar42 = uVar47 + *(int *)((long)K + lVar38 + 0x14) + *(int *)((long)auStack_140 + lVar38 + 4) +
             ((uVar48 ^ uVar49) & uVar43 ^ uVar49) +
             ((uVar43 * 0x80 | uVar43 >> 0x19) ^
             (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6));
    uVar44 = uVar44 + iVar42;
    local_40 = CONCAT44(uVar43,uVar44);
    uVar47 = iVar42 + ((uVar39 | uVar41) & uVar46 | uVar39 & uVar41) +
                      ((uVar39 * 0x400 | uVar39 >> 0x16) ^
                      (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2));
    local_50 = CONCAT44(uVar39,uVar47);
    lVar38 = lVar38 + 0x20;
  } while (lVar38 == 0x28);
  uVar40 = 0x10;
  do {
    iVar42 = (((uint)local_40 << 7 | (uint)local_40 >> 0x19) ^
             ((uint)local_40 << 0x15 | (uint)local_40 >> 0xb) ^
             ((uint)local_40 << 0x1a | (uint)local_40 >> 6)) + uStack_38._4_4_;
    uVar44 = (local_40._4_4_ ^ (uint)uStack_38) & (uint)local_40 ^ (uint)uStack_38;
    uVar47 = auStack_190[uVar40 + 1];
    uVar49 = auStack_190[uVar40 + 0xe];
    iVar45 = (uVar49 >> 10 ^ (uVar49 << 0xd | uVar49 >> 0x13) ^ (uVar49 << 0xf | uVar49 >> 0x11)) +
             auStack_190[uVar40 + 9] + auStack_190[uVar40] +
             (uVar47 >> 3 ^ (uVar47 << 0xe | uVar47 >> 0x12) ^ (uVar47 << 0x19 | uVar47 >> 7));
    (&uStack_150)[uVar40] = iVar45;
    iVar45 = iVar42 + K[uVar40] + uVar44 + iVar45;
    uVar44 = iVar45 + uStack_48._4_4_;
    uStack_48._4_4_ = uVar44;
    uStack_38._4_4_ =
         ((local_50._4_4_ | (uint)local_50) & (uint)uStack_48 | local_50._4_4_ & (uint)local_50) +
         (((uint)local_50 << 10 | (uint)local_50 >> 0x16) ^
         ((uint)local_50 << 0x13 | (uint)local_50 >> 0xd) ^
         ((uint)local_50 << 0x1e | (uint)local_50 >> 2)) + iVar45;
    uVar48 = ((uint)local_40 ^ local_40._4_4_) & uVar44 ^ local_40._4_4_;
    uVar47 = auStack_190[uVar40 + 0xf];
    uVar49 = auStack_190[uVar40 + 2];
    iVar42 = (uVar47 >> 10 ^ (uVar47 << 0xd | uVar47 >> 0x13) ^ (uVar47 << 0xf | uVar47 >> 0x11)) +
             auStack_190[uVar40 + 10] + auStack_190[uVar40 + 1] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    (&uStack_14c)[uVar40] = iVar42;
    iVar42 = iVar42 + uVar48 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             (uint)uStack_38 + K[uVar40 + 1];
    uStack_48._0_4_ = iVar42 + (uint)uStack_48;
    uStack_38._0_4_ =
         (((uint)local_50 | uStack_38._4_4_) & local_50._4_4_ | (uint)local_50 & uStack_38._4_4_) +
         ((uStack_38._4_4_ << 10 | uStack_38._4_4_ >> 0x16) ^
         (uStack_38._4_4_ << 0x13 | uStack_38._4_4_ >> 0xd) ^
         (uStack_38._4_4_ << 0x1e | uStack_38._4_4_ >> 2)) + iVar42;
    iVar45 = (((uint)uStack_48 * 0x80 | (uint)uStack_48 >> 0x19) ^
             ((uint)uStack_48 * 0x200000 | (uint)uStack_48 >> 0xb) ^
             ((uint)uStack_48 * 0x4000000 | (uint)uStack_48 >> 6)) + local_40._4_4_;
    uVar47 = (&uStack_150)[uVar40];
    uVar49 = auStack_190[uVar40 + 3];
    uVar44 = (uStack_48._4_4_ ^ (uint)local_40) & (uint)uStack_48 ^ (uint)local_40;
    iVar42 = (uVar47 >> 10 ^ (uVar47 << 0xd | uVar47 >> 0x13) ^ (uVar47 << 0xf | uVar47 >> 0x11)) +
             auStack_190[uVar40 + 0xb] + auStack_190[uVar40 + 2] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    uVar4 = K[uVar40 + 2];
    (&uStack_148)[uVar40] = iVar42;
    iVar42 = iVar42 + uVar44 + iVar45 + uVar4;
    uVar44 = iVar42 + local_50._4_4_;
    local_50._4_4_ = uVar44;
    local_40._4_4_ =
         ((uStack_38._4_4_ | (uint)uStack_38) & (uint)local_50 | uStack_38._4_4_ & (uint)uStack_38)
         + (((uint)uStack_38 << 10 | (uint)uStack_38 >> 0x16) ^
           ((uint)uStack_38 << 0x13 | (uint)uStack_38 >> 0xd) ^
           ((uint)uStack_38 << 0x1e | (uint)uStack_38 >> 2)) + iVar42;
    uVar47 = (&uStack_14c)[uVar40];
    uVar49 = auStack_190[uVar40 + 4];
    uVar48 = ((uint)uStack_48 ^ uStack_48._4_4_) & uVar44 ^ uStack_48._4_4_;
    iVar42 = (uVar47 >> 10 ^ (uVar47 << 0xd | uVar47 >> 0x13) ^ (uVar47 << 0xf | uVar47 >> 0x11)) +
             auStack_190[uVar40 + 0xc] + auStack_190[uVar40 + 3] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    (&uStack_144)[uVar40] = iVar42;
    iVar42 = iVar42 + uVar48 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             (uint)local_40 + K[uVar40 + 3];
    uVar44 = iVar42 + (uint)local_50;
    local_50._0_4_ = uVar44;
    local_40._0_4_ =
         (((uint)uStack_38 | local_40._4_4_) & uStack_38._4_4_ | (uint)uStack_38 & local_40._4_4_) +
         ((local_40._4_4_ << 10 | local_40._4_4_ >> 0x16) ^
         (local_40._4_4_ << 0x13 | local_40._4_4_ >> 0xd) ^
         (local_40._4_4_ << 0x1e | local_40._4_4_ >> 2)) + iVar42;
    uVar48 = (local_50._4_4_ ^ (uint)uStack_48) & uVar44 ^ (uint)uStack_48;
    uVar47 = auStack_190[uVar40 + 5];
    uVar49 = (&uStack_148)[uVar40];
    uVar47 = (uVar49 >> 10 ^ (uVar49 << 0xd | uVar49 >> 0x13) ^ (uVar49 << 0xf | uVar49 >> 0x11)) +
             auStack_190[uVar40 + 0xd] + auStack_190[uVar40 + 4] +
             (uVar47 >> 3 ^ (uVar47 << 0xe | uVar47 >> 0x12) ^ (uVar47 << 0x19 | uVar47 >> 7));
    auStack_140[uVar40] = uVar47;
    iVar42 = uVar47 + uVar48 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             uStack_48._4_4_ + K[uVar40 + 4];
    uVar44 = iVar42 + uStack_38._4_4_;
    uStack_38._4_4_ = uVar44;
    uStack_48._4_4_ =
         ((local_40._4_4_ | (uint)local_40) & (uint)uStack_38 | local_40._4_4_ & (uint)local_40) +
         (((uint)local_40 << 10 | (uint)local_40 >> 0x16) ^
         ((uint)local_40 << 0x13 | (uint)local_40 >> 0xd) ^
         ((uint)local_40 << 0x1e | (uint)local_40 >> 2)) + iVar42;
    uVar48 = ((uint)local_50 ^ local_50._4_4_) & uVar44 ^ local_50._4_4_;
    uVar47 = (&uStack_144)[uVar40];
    uVar49 = auStack_190[uVar40 + 6];
    uVar47 = (uVar47 >> 10 ^ (uVar47 << 0xd | uVar47 >> 0x13) ^ (uVar47 << 0xf | uVar47 >> 0x11)) +
             auStack_190[uVar40 + 0xe] + auStack_190[uVar40 + 5] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    auStack_140[uVar40 + 1] = uVar47;
    iVar42 = uVar47 + uVar48 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             (uint)uStack_48 + K[uVar40 + 5];
    uVar44 = iVar42 + (uint)uStack_38;
    uStack_38 = CONCAT44(uStack_38._4_4_,uVar44);
    uStack_48 = CONCAT44(uStack_48._4_4_,
                         (((uint)local_40 | uStack_48._4_4_) & local_40._4_4_ |
                         (uint)local_40 & uStack_48._4_4_) +
                         ((uStack_48._4_4_ << 10 | uStack_48._4_4_ >> 0x16) ^
                         (uStack_48._4_4_ << 0x13 | uStack_48._4_4_ >> 0xd) ^
                         (uStack_48._4_4_ << 0x1e | uStack_48._4_4_ >> 2)) + iVar42);
    uVar47 = auStack_140[uVar40];
    uVar49 = auStack_190[uVar40 + 7];
    uVar48 = (uStack_38._4_4_ ^ (uint)local_50) & uVar44 ^ (uint)local_50;
    uVar47 = (uVar47 >> 10 ^ (uVar47 << 0xd | uVar47 >> 0x13) ^ (uVar47 << 0xf | uVar47 >> 0x11)) +
             auStack_190[uVar40 + 0xf] + auStack_190[uVar40 + 6] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    uVar4 = K[uVar40 + 6];
    auStack_140[uVar40 + 2] = uVar47;
    iVar42 = uVar47 + uVar48 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             local_50._4_4_ + uVar4;
    uVar44 = iVar42 + local_40._4_4_;
    local_40._4_4_ = uVar44;
    local_50._4_4_ =
         ((uStack_48._4_4_ | (uint)uStack_48) & (uint)local_40 | uStack_48._4_4_ & (uint)uStack_48)
         + (((uint)uStack_48 << 10 | (uint)uStack_48 >> 0x16) ^
           ((uint)uStack_48 << 0x13 | (uint)uStack_48 >> 0xd) ^
           ((uint)uStack_48 << 0x1e | (uint)uStack_48 >> 2)) + iVar42;
    uVar47 = auStack_140[uVar40 + 1];
    uVar49 = auStack_190[uVar40 + 8];
    uVar48 = ((uint)uStack_38 ^ uStack_38._4_4_) & uVar44 ^ uStack_38._4_4_;
    uVar47 = (uVar47 >> 10 ^ (uVar47 << 0xd | uVar47 >> 0x13) ^ (uVar47 << 0xf | uVar47 >> 0x11)) +
             (&uStack_150)[uVar40] + auStack_190[uVar40 + 7] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    auStack_140[uVar40 + 3] = uVar47;
    local_158[0] = uVar47 + uVar48 +
                   ((uVar44 * 0x80 | uVar44 >> 0x19) ^
                   (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
                   (uint)local_50 + K[uVar40 + 7];
    local_158[1] = (((uint)uStack_48 | local_50._4_4_) & uStack_48._4_4_ |
                   (uint)uStack_48 & local_50._4_4_) +
                   ((local_50._4_4_ << 10 | local_50._4_4_ >> 0x16) ^
                   (local_50._4_4_ << 0x13 | local_50._4_4_ >> 0xd) ^
                   (local_50._4_4_ << 0x1e | local_50._4_4_ >> 2));
    local_40 = CONCAT44(local_40._4_4_,(uint)local_40 + local_158[0]);
    local_50 = CONCAT44(local_50._4_4_,local_158[1] + local_158[0]);
    bVar50 = uVar40 < 0x38;
    uVar40 = uVar40 + 8;
  } while (bVar50);
  lVar38 = 0;
  do {
    lVar1 = lVar38 * 4;
    iVar42 = *(int *)((long)&local_50 + lVar1 + 4);
    iVar45 = *(int *)((long)&uStack_48 + lVar1);
    iVar28 = *(int *)((long)&uStack_48 + lVar1 + 4);
    puVar2 = ctx->state + lVar38;
    uVar4 = puVar2[1];
    uVar29 = puVar2[2];
    uVar30 = puVar2[3];
    puVar3 = ctx->state + lVar38;
    *puVar3 = *puVar2 + *(int *)((long)&local_50 + lVar1);
    puVar3[1] = uVar4 + iVar42;
    puVar3[2] = uVar29 + iVar45;
    puVar3[3] = uVar30 + iVar28;
    lVar38 = lVar38 + 4;
  } while (lVar38 != 8);
  uStack_160 = 0x4abbab;
  mbedtls_platform_zeroize(auStack_190 + 0xe,0x128);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}